

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_SurfaceCurvature> *a)

{
  int iVar1;
  bool bVar2;
  ON__INT32 i;
  
  iVar1 = a->m_count;
  i = 0;
  if (0 < iVar1) {
    i = iVar1;
  }
  bVar2 = WriteInt(this,i);
  if (bVar2 && 0 < iVar1) {
    bVar2 = WriteDouble(this,(ulong)(uint)(i * 2),&a->m_a->k1);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_SurfaceCurvature>& a )
{
  int count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  if ( rc && count > 0 ) {
    rc = WriteDouble( count*2, &a.Array()->k1 );
  }
  return rc;
}